

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::Sign(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  Vector3<double> local_38;
  S2Point *local_20;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_20 = c;
  c_local = b;
  b_local = a;
  Vector3<double>::CrossProd(&local_38,a,b);
  iVar1 = Sign(a,b,c,&local_38);
  return iVar1;
}

Assistant:

int Sign(const S2Point& a, const S2Point& b, const S2Point& c) {
  // We don't need RobustCrossProd() here because Sign() does its own
  // error estimation and calls ExpensiveSign() if there is any uncertainty
  // about the result.
  return Sign(a, b, c, a.CrossProd(b));
}